

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O3

void __thiscall
cbtSortedOverlappingPairCache::cbtSortedOverlappingPairCache(cbtSortedOverlappingPairCache *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtBroadphasePair *pcVar3;
  undefined8 uVar4;
  cbtBroadphasePair *pcVar5;
  long lVar6;
  long lVar7;
  
  (this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
  _vptr_cbtOverlappingPairCallback = (_func_int **)&PTR__cbtSortedOverlappingPairCache_00b47500;
  (this->m_overlappingPairArray).m_ownsMemory = true;
  (this->m_overlappingPairArray).m_data = (cbtBroadphasePair *)0x0;
  (this->m_overlappingPairArray).m_size = 0;
  (this->m_overlappingPairArray).m_capacity = 0;
  this->m_blockedForChanges = false;
  this->m_hasDeferredRemoval = true;
  this->m_overlapFilterCallback = (cbtOverlapFilterCallback *)0x0;
  this->m_ghostPairCallback = (cbtOverlappingPairCallback *)0x0;
  pcVar5 = (cbtBroadphasePair *)cbtAlignedAllocInternal(0x40,0x10);
  lVar6 = (long)(this->m_overlappingPairArray).m_size;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      pcVar3 = (this->m_overlappingPairArray).m_data;
      puVar1 = (undefined8 *)((long)&pcVar3->m_pProxy0 + lVar7);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pcVar5->m_pProxy0 + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      *(undefined8 *)((long)&pcVar5->m_algorithm + lVar7) =
           *(undefined8 *)((long)&pcVar3->m_algorithm + lVar7);
      *(undefined8 *)((long)&pcVar5->field_3 + lVar7) =
           *(undefined8 *)((long)&pcVar3->field_3 + lVar7);
      lVar7 = lVar7 + 0x20;
    } while (lVar6 * 0x20 != lVar7);
  }
  pcVar3 = (this->m_overlappingPairArray).m_data;
  if ((pcVar3 != (cbtBroadphasePair *)0x0) && ((this->m_overlappingPairArray).m_ownsMemory == true))
  {
    cbtAlignedFreeInternal(pcVar3);
  }
  (this->m_overlappingPairArray).m_ownsMemory = true;
  (this->m_overlappingPairArray).m_data = pcVar5;
  (this->m_overlappingPairArray).m_capacity = 2;
  return;
}

Assistant:

cbtSortedOverlappingPairCache::cbtSortedOverlappingPairCache() : m_blockedForChanges(false),
															   m_hasDeferredRemoval(true),
															   m_overlapFilterCallback(0),
															   m_ghostPairCallback(0)
{
	int initialAllocatedSize = 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
}